

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void DoAccept<true>::Do(XamlData *data,cmSourceFile *f)

{
  string *psVar1;
  undefined1 local_88 [8];
  string cppFileName;
  undefined1 local_58 [8];
  string hFileName;
  string xaml;
  cmSourceFile *f_local;
  XamlData *data_local;
  
  xaml.field_2._8_8_ = f;
  psVar1 = cmSourceFile::GetFullPath(f,(string *)0x0);
  std::__cxx11::string::string((string *)(hFileName.field_2._M_local_buf + 8),(string *)psVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (hFileName.field_2._M_local_buf + 8),".h");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&hFileName.field_2 + 8),".cpp");
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&data->ExpectedXamlHeaders,(value_type *)local_58);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&data->ExpectedXamlSources,(value_type *)local_88);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
            (&data->XamlSources,(value_type *)((long)&xaml.field_2 + 8));
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(hFileName.field_2._M_local_buf + 8));
  return;
}

Assistant:

static void Do(cmGeneratorTarget::XamlData& data, cmSourceFile* f)
    {
    // Build and save the name of the corresponding .h and .cpp file
    // This relationship will be used later when building the project files.
    // Both names would have been auto generated from Visual Studio
    // where the user supplied the file name and Visual Studio
    // appended the suffix.
    std::string xaml = f->GetFullPath();
    std::string hFileName = xaml + ".h";
    std::string cppFileName = xaml + ".cpp";
    data.ExpectedXamlHeaders.insert(hFileName);
    data.ExpectedXamlSources.insert(cppFileName);
    data.XamlSources.push_back(f);
    }